

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> this_00;
  size_t sVar3;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_f0;
  Var local_e8;
  Location local_98;
  Var local_78;
  
  if ((ulong)sig_index <
      (ulong)((long)(this->module_->types).
                    super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->module_->types).
                    super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
    this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x108);
    local_e8.loc.field_1.field_0.line = 0;
    local_e8.loc.field_1.field_0.first_column = 0;
    local_e8.loc.field_1.field_0.last_column = 0;
    local_e8.loc.filename.data_ = (char *)0x0;
    local_e8.loc.filename.size_._0_4_ = 0;
    local_e8.loc.filename.size_._4_4_ = 0;
    CallIndirectExpr::CallIndirectExpr
              ((CallIndirectExpr *)
               this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,&local_e8.loc);
    __s = this->filename_;
    OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    local_e8.loc.field_1.field_0.last_column = 0;
    sVar3 = strlen(__s);
    local_e8.loc.filename.size_._0_4_ = (undefined4)sVar3;
    local_e8.loc.filename.size_._4_4_ = (undefined4)(sVar3 >> 0x20);
    local_e8.loc.field_1.field_0.line = (int)OVar1;
    local_e8.loc.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
    local_e8.loc.filename.data_ = __s;
    Var::Var(&local_78,sig_index,&local_e8.loc);
    SetFuncDeclaration(this,(FuncDeclaration *)
                            ((long)this_00.
                                   super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                   .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),
                       &local_78);
    Var::~Var(&local_78);
    local_98.field_1.field_0.line = 0;
    local_98.field_1._4_8_ = 0;
    local_98.filename.data_ = (char *)0x0;
    local_98.filename.size_._0_4_ = 0;
    local_98.filename.size_._4_4_ = 0;
    Var::Var(&local_e8,table_index,&local_98);
    Var::operator=((Var *)((long)this_00.
                                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                 .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xc0),
                   &local_e8);
    Var::~Var(&local_e8);
    local_f0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
         (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
         this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
    if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
        local_f0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
        super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
      (**(code **)(*(long *)local_f0._M_t.
                            super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                            super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
    }
    return (Result)RVar2.enum_;
  }
  __assert_fail("sig_index < module_->types.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-reader-ir.cc"
                ,0x2d0,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnCallIndirectExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnCallIndirectExpr(Index sig_index, Index table_index) {
  assert(sig_index < module_->types.size());
  auto expr = MakeUnique<CallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index);
  return AppendExpr(std::move(expr));
}